

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::LoadableGetStateBlock_x
          (ChElementShellANCF_3833 *this,int block_offset,ChState *mD)

{
  element_type *peVar1;
  double *pdVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((-1 < block_offset) &&
     ((long)block_offset <=
      (mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
    pdVar2 = (mD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             block_offset;
    uVar3 = 3;
    if ((((ulong)pdVar2 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar3 = uVar4;
    }
    peVar1 = (((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0x20);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (uVar3 < 3) {
      do {
        pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar3 * 8 + 0x20);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 3);
    }
    uVar3 = (ulong)(uint)block_offset;
    if ((long)(uVar3 + 3) <=
        (mD->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar2 = (mD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar3 + 3;
      uVar4 = 3;
      if ((((ulong)pdVar2 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
        uVar4 = uVar5;
      }
      peVar1 = (((this->m_nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          pdVar2[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0xf0);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (uVar4 < 3) {
        do {
          pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0xf0);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      if ((long)(uVar3 + 6) <=
          (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar2 = (mD->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar3 + 6;
        uVar4 = 3;
        if ((((ulong)pdVar2 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
          uVar4 = uVar5;
        }
        peVar1 = (((this->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if (uVar4 != 0) {
          uVar5 = 0;
          do {
            pdVar2[uVar5] = *(double *)((long)&peVar1->DD_dt + uVar5 * 8 + 0xffffffffffffffe8);
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        if (uVar4 < 3) {
          do {
            pdVar2[uVar4] = *(double *)((long)&peVar1->DD_dt + uVar4 * 8 + 0xffffffffffffffe8);
            uVar4 = uVar4 + 1;
          } while (uVar4 != 3);
        }
        if ((long)(uVar3 + 9) <=
            (mD->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
          pdVar2 = (mD->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   uVar3 + 9;
          uVar4 = 3;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
            uVar4 = uVar5;
          }
          peVar1 = (this->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (uVar4 != 0) {
            uVar5 = 0;
            do {
              pdVar2[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0x20);
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          if (uVar4 < 3) {
            do {
              pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0x20);
              uVar4 = uVar4 + 1;
            } while (uVar4 != 3);
          }
          if ((long)(uVar3 + 0xc) <=
              (mD->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)
          {
            pdVar2 = (mD->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + uVar3 + 0xc;
            uVar4 = 3;
            if ((((ulong)pdVar2 & 7) == 0) &&
               (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
              uVar4 = uVar5;
            }
            peVar1 = (this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (uVar4 != 0) {
              uVar5 = 0;
              do {
                pdVar2[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0xf0);
                uVar5 = uVar5 + 1;
              } while (uVar4 != uVar5);
            }
            if (uVar4 < 3) {
              do {
                pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0xf0);
                uVar4 = uVar4 + 1;
              } while (uVar4 != 3);
            }
            if ((long)(uVar3 + 0xf) <=
                (mD->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3
               ) {
              pdVar2 = (mD->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + uVar3 + 0xf;
              uVar4 = 3;
              if ((((ulong)pdVar2 & 7) == 0) &&
                 (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
                uVar4 = uVar5;
              }
              peVar1 = (this->m_nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (uVar4 != 0) {
                uVar5 = 0;
                do {
                  pdVar2[uVar5] = *(double *)((long)&peVar1->DD_dt + uVar5 * 8 + 0xffffffffffffffe8)
                  ;
                  uVar5 = uVar5 + 1;
                } while (uVar4 != uVar5);
              }
              if (uVar4 < 3) {
                do {
                  pdVar2[uVar4] = *(double *)((long)&peVar1->DD_dt + uVar4 * 8 + 0xffffffffffffffe8)
                  ;
                  uVar4 = uVar4 + 1;
                } while (uVar4 != 3);
              }
              if ((long)(uVar3 + 0x12) <=
                  (mD->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                  -3) {
                pdVar2 = (mD->super_ChVectorDynamic<double>).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data + uVar3 + 0x12;
                uVar4 = 3;
                if ((((ulong)pdVar2 & 7) == 0) &&
                   (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
                  uVar4 = uVar5;
                }
                peVar1 = (this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                if (uVar4 != 0) {
                  uVar5 = 0;
                  do {
                    pdVar2[uVar5] =
                         *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0x20);
                    uVar5 = uVar5 + 1;
                  } while (uVar4 != uVar5);
                }
                if (uVar4 < 3) {
                  do {
                    pdVar2[uVar4] =
                         *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0x20);
                    uVar4 = uVar4 + 1;
                  } while (uVar4 != 3);
                }
                if ((long)(uVar3 + 0x15) <=
                    (mD->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                    + -3) {
                  pdVar2 = (mD->super_ChVectorDynamic<double>).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data + uVar3 + 0x15;
                  uVar4 = 3;
                  if ((((ulong)pdVar2 & 7) == 0) &&
                     (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
                    uVar4 = uVar5;
                  }
                  peVar1 = (this->m_nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  if (uVar4 != 0) {
                    uVar5 = 0;
                    do {
                      pdVar2[uVar5] =
                           *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0xf0);
                      uVar5 = uVar5 + 1;
                    } while (uVar4 != uVar5);
                  }
                  if (uVar4 < 3) {
                    do {
                      pdVar2[uVar4] =
                           *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0xf0);
                      uVar4 = uVar4 + 1;
                    } while (uVar4 != 3);
                  }
                  if ((long)(uVar3 + 0x18) <=
                      (mD->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows + -3) {
                    pdVar2 = (mD->super_ChVectorDynamic<double>).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data + uVar3 + 0x18;
                    uVar4 = 3;
                    if ((((ulong)pdVar2 & 7) == 0) &&
                       (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3))
                    {
                      uVar4 = uVar5;
                    }
                    peVar1 = (this->m_nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    if (uVar4 != 0) {
                      uVar5 = 0;
                      do {
                        pdVar2[uVar5] =
                             *(double *)((long)&peVar1->DD_dt + uVar5 * 8 + 0xffffffffffffffe8);
                        uVar5 = uVar5 + 1;
                      } while (uVar4 != uVar5);
                    }
                    if (uVar4 < 3) {
                      do {
                        pdVar2[uVar4] =
                             *(double *)((long)&peVar1->DD_dt + uVar4 * 8 + 0xffffffffffffffe8);
                        uVar4 = uVar4 + 1;
                      } while (uVar4 != 3);
                    }
                    if ((long)(uVar3 + 0x1b) <=
                        (mD->super_ChVectorDynamic<double>).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows + -3) {
                      pdVar2 = (mD->super_ChVectorDynamic<double>).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data + uVar3 + 0x1b;
                      uVar4 = 3;
                      if ((((ulong)pdVar2 & 7) == 0) &&
                         (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3
                         )) {
                        uVar4 = uVar5;
                      }
                      peVar1 = (this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      if (uVar4 != 0) {
                        uVar5 = 0;
                        do {
                          pdVar2[uVar5] =
                               *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0x20);
                          uVar5 = uVar5 + 1;
                        } while (uVar4 != uVar5);
                      }
                      if (uVar4 < 3) {
                        do {
                          pdVar2[uVar4] =
                               *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0x20);
                          uVar4 = uVar4 + 1;
                        } while (uVar4 != 3);
                      }
                      if ((long)(uVar3 + 0x1e) <=
                          (mD->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows + -3) {
                        pdVar2 = (mD->super_ChVectorDynamic<double>).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data + uVar3 + 0x1e;
                        uVar4 = 3;
                        if ((((ulong)pdVar2 & 7) == 0) &&
                           (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                           uVar5 < 3)) {
                          uVar4 = uVar5;
                        }
                        peVar1 = (this->m_nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[3].
                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        if (uVar4 != 0) {
                          uVar5 = 0;
                          do {
                            pdVar2[uVar5] =
                                 *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0xf0);
                            uVar5 = uVar5 + 1;
                          } while (uVar4 != uVar5);
                        }
                        if (uVar4 < 3) {
                          do {
                            pdVar2[uVar4] =
                                 *(double *)((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0xf0);
                            uVar4 = uVar4 + 1;
                          } while (uVar4 != 3);
                        }
                        if ((long)(uVar3 + 0x21) <=
                            (mD->super_ChVectorDynamic<double>).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows + -3) {
                          pdVar2 = (mD->super_ChVectorDynamic<double>).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data + uVar3 + 0x21;
                          uVar4 = 3;
                          if ((((ulong)pdVar2 & 7) == 0) &&
                             (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                             uVar5 < 3)) {
                            uVar4 = uVar5;
                          }
                          peVar1 = (this->m_nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[3].
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          if (uVar4 != 0) {
                            uVar5 = 0;
                            do {
                              pdVar2[uVar5] =
                                   *(double *)
                                    ((long)&peVar1->DD_dt + uVar5 * 8 + 0xffffffffffffffe8);
                              uVar5 = uVar5 + 1;
                            } while (uVar4 != uVar5);
                          }
                          if (uVar4 < 3) {
                            do {
                              pdVar2[uVar4] =
                                   *(double *)
                                    ((long)&peVar1->DD_dt + uVar4 * 8 + 0xffffffffffffffe8);
                              uVar4 = uVar4 + 1;
                            } while (uVar4 != 3);
                          }
                          if ((long)(uVar3 + 0x24) <=
                              (mD->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + -3) {
                            pdVar2 = (mD->super_ChVectorDynamic<double>).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + uVar3 + 0x24;
                            uVar4 = 3;
                            if ((((ulong)pdVar2 & 7) == 0) &&
                               (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                               uVar5 < 3)) {
                              uVar4 = uVar5;
                            }
                            peVar1 = (this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[4].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            if (uVar4 != 0) {
                              uVar5 = 0;
                              do {
                                pdVar2[uVar5] =
                                     *(double *)
                                      ((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0x20);
                                uVar5 = uVar5 + 1;
                              } while (uVar4 != uVar5);
                            }
                            if (uVar4 < 3) {
                              do {
                                pdVar2[uVar4] =
                                     *(double *)
                                      ((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0x20);
                                uVar4 = uVar4 + 1;
                              } while (uVar4 != 3);
                            }
                            if ((long)(uVar3 + 0x27) <=
                                (mD->super_ChVectorDynamic<double>).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows + -3) {
                              pdVar2 = (mD->super_ChVectorDynamic<double>).
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + uVar3 + 0x27;
                              uVar4 = 3;
                              if ((((ulong)pdVar2 & 7) == 0) &&
                                 (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                                 uVar5 < 3)) {
                                uVar4 = uVar5;
                              }
                              peVar1 = (this->m_nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[4].
                                       super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              if (uVar4 != 0) {
                                uVar5 = 0;
                                do {
                                  pdVar2[uVar5] =
                                       *(double *)
                                        ((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0xf0);
                                  uVar5 = uVar5 + 1;
                                } while (uVar4 != uVar5);
                              }
                              if (uVar4 < 3) {
                                do {
                                  pdVar2[uVar4] =
                                       *(double *)
                                        ((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0xf0);
                                  uVar4 = uVar4 + 1;
                                } while (uVar4 != 3);
                              }
                              if ((long)(uVar3 + 0x2a) <=
                                  (mD->super_ChVectorDynamic<double>).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows + -3) {
                                pdVar2 = (mD->super_ChVectorDynamic<double>).
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + uVar3 + 0x2a;
                                uVar4 = 3;
                                if ((((ulong)pdVar2 & 7) == 0) &&
                                   (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                                   uVar5 < 3)) {
                                  uVar4 = uVar5;
                                }
                                peVar1 = (this->m_nodes).
                                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[4].
                                         super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                if (uVar4 != 0) {
                                  uVar5 = 0;
                                  do {
                                    pdVar2[uVar5] =
                                         *(double *)
                                          ((long)&peVar1->DD_dt + uVar5 * 8 + 0xffffffffffffffe8);
                                    uVar5 = uVar5 + 1;
                                  } while (uVar4 != uVar5);
                                }
                                if (uVar4 < 3) {
                                  do {
                                    pdVar2[uVar4] =
                                         *(double *)
                                          ((long)&peVar1->DD_dt + uVar4 * 8 + 0xffffffffffffffe8);
                                    uVar4 = uVar4 + 1;
                                  } while (uVar4 != 3);
                                }
                                if ((long)(uVar3 + 0x2d) <=
                                    (mD->super_ChVectorDynamic<double>).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows + -3) {
                                  pdVar2 = (mD->super_ChVectorDynamic<double>).
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + uVar3 + 0x2d;
                                  uVar4 = 3;
                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                     (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7
                                                     ), uVar5 < 3)) {
                                    uVar4 = uVar5;
                                  }
                                  peVar1 = (this->m_nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[5].
                                           super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                                  if (uVar4 != 0) {
                                    uVar5 = 0;
                                    do {
                                      pdVar2[uVar5] =
                                           *(double *)
                                            ((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0x20);
                                      uVar5 = uVar5 + 1;
                                    } while (uVar4 != uVar5);
                                  }
                                  if (uVar4 < 3) {
                                    do {
                                      pdVar2[uVar4] =
                                           *(double *)
                                            ((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0x20);
                                      uVar4 = uVar4 + 1;
                                    } while (uVar4 != 3);
                                  }
                                  if ((long)(uVar3 + 0x30) <=
                                      (mD->super_ChVectorDynamic<double>).
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows + -3) {
                                    pdVar2 = (mD->super_ChVectorDynamic<double>).
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_data + uVar3 + 0x30;
                                    uVar4 = 3;
                                    if ((((ulong)pdVar2 & 7) == 0) &&
                                       (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) &
                                                       7), uVar5 < 3)) {
                                      uVar4 = uVar5;
                                    }
                                    peVar1 = (this->m_nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5].
                                             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr;
                                    if (uVar4 != 0) {
                                      uVar5 = 0;
                                      do {
                                        pdVar2[uVar5] =
                                             *(double *)
                                              ((long)&peVar1->super_ChNodeFEAxyzD + uVar5 * 8 + 0xf0
                                              );
                                        uVar5 = uVar5 + 1;
                                      } while (uVar4 != uVar5);
                                    }
                                    if (uVar4 < 3) {
                                      do {
                                        pdVar2[uVar4] =
                                             *(double *)
                                              ((long)&peVar1->super_ChNodeFEAxyzD + uVar4 * 8 + 0xf0
                                              );
                                        uVar4 = uVar4 + 1;
                                      } while (uVar4 != 3);
                                    }
                                    if ((long)(uVar3 + 0x33) <=
                                        (mD->super_ChVectorDynamic<double>).
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows + -3) {
                                      pdVar2 = (mD->super_ChVectorDynamic<double>).
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + uVar3 + 0x33;
                                      uVar4 = 3;
                                      if ((((ulong)pdVar2 & 7) == 0) &&
                                         (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff)
                                                         & 7), uVar5 < 3)) {
                                        uVar4 = uVar5;
                                      }
                                      peVar1 = (this->m_nodes).
                                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[5].
                                               super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr;
                                      if (uVar4 != 0) {
                                        uVar5 = 0;
                                        do {
                                          pdVar2[uVar5] =
                                               *(double *)
                                                ((long)&peVar1->DD_dt +
                                                uVar5 * 8 + 0xffffffffffffffe8);
                                          uVar5 = uVar5 + 1;
                                        } while (uVar4 != uVar5);
                                      }
                                      if (uVar4 < 3) {
                                        do {
                                          pdVar2[uVar4] =
                                               *(double *)
                                                ((long)&peVar1->DD_dt +
                                                uVar4 * 8 + 0xffffffffffffffe8);
                                          uVar4 = uVar4 + 1;
                                        } while (uVar4 != 3);
                                      }
                                      if ((long)(uVar3 + 0x36) <=
                                          (mD->super_ChVectorDynamic<double>).
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows + -3) {
                                        pdVar2 = (mD->super_ChVectorDynamic<double>).
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_data + uVar3 + 0x36;
                                        uVar4 = 3;
                                        if ((((ulong)pdVar2 & 7) == 0) &&
                                           (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                             0x1fffffff) & 7), uVar5 < 3)) {
                                          uVar4 = uVar5;
                                        }
                                        peVar1 = (this->m_nodes).
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[6].
                                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr;
                                        if (uVar4 != 0) {
                                          uVar5 = 0;
                                          do {
                                            pdVar2[uVar5] =
                                                 *(double *)
                                                  ((long)&peVar1->super_ChNodeFEAxyzD +
                                                  uVar5 * 8 + 0x20);
                                            uVar5 = uVar5 + 1;
                                          } while (uVar4 != uVar5);
                                        }
                                        if (uVar4 < 3) {
                                          do {
                                            pdVar2[uVar4] =
                                                 *(double *)
                                                  ((long)&peVar1->super_ChNodeFEAxyzD +
                                                  uVar4 * 8 + 0x20);
                                            uVar4 = uVar4 + 1;
                                          } while (uVar4 != 3);
                                        }
                                        if ((long)(uVar3 + 0x39) <=
                                            (mD->super_ChVectorDynamic<double>).
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows + -3) {
                                          pdVar2 = (mD->super_ChVectorDynamic<double>).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar3 + 0x39;
                                          uVar4 = 3;
                                          if ((((ulong)pdVar2 & 7) == 0) &&
                                             (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                               0x1fffffff) & 7), uVar5 < 3)) {
                                            uVar4 = uVar5;
                                          }
                                          peVar1 = (this->m_nodes).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                          if (uVar4 != 0) {
                                            uVar5 = 0;
                                            do {
                                              pdVar2[uVar5] =
                                                   *(double *)
                                                    ((long)&peVar1->super_ChNodeFEAxyzD +
                                                    uVar5 * 8 + 0xf0);
                                              uVar5 = uVar5 + 1;
                                            } while (uVar4 != uVar5);
                                          }
                                          if (uVar4 < 3) {
                                            do {
                                              pdVar2[uVar4] =
                                                   *(double *)
                                                    ((long)&peVar1->super_ChNodeFEAxyzD +
                                                    uVar4 * 8 + 0xf0);
                                              uVar4 = uVar4 + 1;
                                            } while (uVar4 != 3);
                                          }
                                          if ((long)(uVar3 + 0x3c) <=
                                              (mD->super_ChVectorDynamic<double>).
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                              .m_storage.m_rows + -3) {
                                            pdVar2 = (mD->super_ChVectorDynamic<double>).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar3 + 0x3c;
                                            uVar4 = 3;
                                            if ((((ulong)pdVar2 & 7) == 0) &&
                                               (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                 0x1fffffff) & 7), uVar5 < 3)) {
                                              uVar4 = uVar5;
                                            }
                                            peVar1 = (this->m_nodes).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                            if (uVar4 != 0) {
                                              uVar5 = 0;
                                              do {
                                                pdVar2[uVar5] =
                                                     *(double *)
                                                      ((long)&peVar1->DD_dt +
                                                      uVar5 * 8 + 0xffffffffffffffe8);
                                                uVar5 = uVar5 + 1;
                                              } while (uVar4 != uVar5);
                                            }
                                            if (uVar4 < 3) {
                                              do {
                                                pdVar2[uVar4] =
                                                     *(double *)
                                                      ((long)&peVar1->DD_dt +
                                                      uVar4 * 8 + 0xffffffffffffffe8);
                                                uVar4 = uVar4 + 1;
                                              } while (uVar4 != 3);
                                            }
                                            if ((long)(uVar3 + 0x3f) <=
                                                (mD->super_ChVectorDynamic<double>).
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows + -3) {
                                              pdVar2 = (mD->super_ChVectorDynamic<double>).
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar3 + 0x3f;
                                              uVar4 = 3;
                                              if ((((ulong)pdVar2 & 7) == 0) &&
                                                 (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                   0x1fffffff) & 7), uVar5 < 3)) {
                                                uVar4 = uVar5;
                                              }
                                              peVar1 = (this->m_nodes).
                                                                                                              
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                              if (uVar4 != 0) {
                                                uVar5 = 0;
                                                do {
                                                  pdVar2[uVar5] =
                                                       *(double *)
                                                        ((long)&peVar1->super_ChNodeFEAxyzD +
                                                        uVar5 * 8 + 0x20);
                                                  uVar5 = uVar5 + 1;
                                                } while (uVar4 != uVar5);
                                              }
                                              if (uVar4 < 3) {
                                                do {
                                                  pdVar2[uVar4] =
                                                       *(double *)
                                                        ((long)&peVar1->super_ChNodeFEAxyzD +
                                                        uVar4 * 8 + 0x20);
                                                  uVar4 = uVar4 + 1;
                                                } while (uVar4 != 3);
                                              }
                                              if ((long)(uVar3 + 0x42) <=
                                                  (mD->super_ChVectorDynamic<double>).
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + -3) {
                                                pdVar2 = (mD->super_ChVectorDynamic<double>).
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar3 + 0x42;
                                                uVar4 = 3;
                                                if ((((ulong)pdVar2 & 7) == 0) &&
                                                   (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                     0x1fffffff) & 7), uVar5 < 3)) {
                                                  uVar4 = uVar5;
                                                }
                                                peVar1 = (this->m_nodes).
                                                                                                                  
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                if (uVar4 != 0) {
                                                  uVar5 = 0;
                                                  do {
                                                    pdVar2[uVar5] =
                                                         *(double *)
                                                          ((long)&peVar1->super_ChNodeFEAxyzD +
                                                          uVar5 * 8 + 0xf0);
                                                    uVar5 = uVar5 + 1;
                                                  } while (uVar4 != uVar5);
                                                }
                                                if (uVar4 < 3) {
                                                  do {
                                                    pdVar2[uVar4] =
                                                         *(double *)
                                                          ((long)&peVar1->super_ChNodeFEAxyzD +
                                                          uVar4 * 8 + 0xf0);
                                                    uVar4 = uVar4 + 1;
                                                  } while (uVar4 != 3);
                                                }
                                                if ((long)(uVar3 + 0x45) <=
                                                    (mD->super_ChVectorDynamic<double>).
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + -3) {
                                                  pdVar2 = (mD->super_ChVectorDynamic<double>).
                                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar3 + 0x45;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->DD_dt +
                                                            uVar4 * 8 + 0xffffffffffffffe8);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->DD_dt +
                                                            uVar3 * 8 + 0xffffffffffffffe8);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  return;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementShellANCF_3833::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[0]->GetDD().eigen();

    mD.segment(block_offset + 9, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 12, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[1]->GetDD().eigen();

    mD.segment(block_offset + 18, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(block_offset + 24, 3) = m_nodes[2]->GetDD().eigen();

    mD.segment(block_offset + 27, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 30, 3) = m_nodes[3]->GetD().eigen();
    mD.segment(block_offset + 33, 3) = m_nodes[3]->GetDD().eigen();

    mD.segment(block_offset + 36, 3) = m_nodes[4]->GetPos().eigen();
    mD.segment(block_offset + 39, 3) = m_nodes[4]->GetD().eigen();
    mD.segment(block_offset + 42, 3) = m_nodes[4]->GetDD().eigen();

    mD.segment(block_offset + 45, 3) = m_nodes[5]->GetPos().eigen();
    mD.segment(block_offset + 48, 3) = m_nodes[5]->GetD().eigen();
    mD.segment(block_offset + 51, 3) = m_nodes[5]->GetDD().eigen();

    mD.segment(block_offset + 54, 3) = m_nodes[6]->GetPos().eigen();
    mD.segment(block_offset + 57, 3) = m_nodes[6]->GetD().eigen();
    mD.segment(block_offset + 60, 3) = m_nodes[6]->GetDD().eigen();

    mD.segment(block_offset + 63, 3) = m_nodes[7]->GetPos().eigen();
    mD.segment(block_offset + 66, 3) = m_nodes[7]->GetD().eigen();
    mD.segment(block_offset + 69, 3) = m_nodes[7]->GetDD().eigen();
}